

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O3

void __thiscall spirv_cross::CompilerHLSL::emit_builtin_outputs_in_struct(CompilerHLSL *this)

{
  size_t count;
  char *pcVar1;
  uint *puVar2;
  _Hash_node_base *p_Var3;
  long lVar4;
  long lVar5;
  uint32_t i;
  ulong uVar6;
  bool legacy;
  bool local_79;
  SmallVector<unsigned_int,_8UL> local_78;
  anon_class_24_3_7215ebb4 local_40;
  
  local_40.execution = Compiler::get_entry_point((Compiler *)this);
  local_79 = (this->hlsl_options).shader_model < 0x1f;
  local_40.legacy = &local_79;
  uVar6 = 0;
  local_40.this = this;
  do {
    if (((this->super_CompilerGLSL).super_Compiler.active_output_builtins.lower >> (uVar6 & 0x3f) &
        1) != 0) {
      emit_builtin_outputs_in_struct::anon_class_24_3_7215ebb4::operator()
                (&local_40,(uint32_t)uVar6);
    }
    uVar6 = uVar6 + 1;
  } while (uVar6 != 0x40);
  count = (this->super_CompilerGLSL).super_Compiler.active_output_builtins.higher._M_h.
          _M_element_count;
  if (count != 0) {
    local_78.super_VectorView<unsigned_int>.buffer_size = 0;
    local_78.buffer_capacity = 8;
    local_78.super_VectorView<unsigned_int>.ptr = (uint *)&local_78.stack_storage;
    SmallVector<unsigned_int,_8UL>::reserve(&local_78,count);
    p_Var3 = (this->super_CompilerGLSL).super_Compiler.active_output_builtins.higher._M_h.
             _M_before_begin._M_nxt;
    if (p_Var3 != (_Hash_node_base *)0x0) {
      do {
        SmallVector<unsigned_int,_8UL>::reserve
                  (&local_78,local_78.super_VectorView<unsigned_int>.buffer_size + 1);
        *(undefined4 *)
         ((char *)local_78.super_VectorView<unsigned_int>.ptr +
         local_78.super_VectorView<unsigned_int>.buffer_size * 4) = *(undefined4 *)&p_Var3[1]._M_nxt
        ;
        local_78.super_VectorView<unsigned_int>.buffer_size =
             local_78.super_VectorView<unsigned_int>.buffer_size + 1;
        p_Var3 = p_Var3->_M_nxt;
      } while (p_Var3 != (_Hash_node_base *)0x0);
    }
    puVar2 = local_78.super_VectorView<unsigned_int>.ptr;
    if (local_78.super_VectorView<unsigned_int>.buffer_size != 0) {
      lVar5 = local_78.super_VectorView<unsigned_int>.buffer_size * 4;
      pcVar1 = (char *)local_78.super_VectorView<unsigned_int>.ptr;
      lVar4 = 0x3f;
      if (local_78.super_VectorView<unsigned_int>.buffer_size != 0) {
        for (; local_78.super_VectorView<unsigned_int>.buffer_size >> lVar4 == 0; lVar4 = lVar4 + -1
            ) {
        }
      }
      ::std::__introsort_loop<unsigned_int*,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_78.super_VectorView<unsigned_int>.ptr,pcVar1 + lVar5,
                 ((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
      ::std::__final_insertion_sort<unsigned_int*,__gnu_cxx::__ops::_Iter_less_iter>
                (puVar2,pcVar1 + lVar5);
      puVar2 = local_78.super_VectorView<unsigned_int>.ptr;
      if (local_78.super_VectorView<unsigned_int>.buffer_size != 0) {
        lVar4 = local_78.super_VectorView<unsigned_int>.buffer_size << 2;
        lVar5 = 0;
        do {
          emit_builtin_outputs_in_struct::anon_class_24_3_7215ebb4::operator()
                    (&local_40,*(uint32_t *)((char *)puVar2 + lVar5));
          lVar5 = lVar5 + 4;
        } while (lVar4 != lVar5);
      }
    }
    local_78.super_VectorView<unsigned_int>.buffer_size = 0;
    if ((AlignedBuffer<unsigned_int,_8UL> *)local_78.super_VectorView<unsigned_int>.ptr !=
        &local_78.stack_storage) {
      free(local_78.super_VectorView<unsigned_int>.ptr);
    }
  }
  return;
}

Assistant:

void CompilerHLSL::emit_builtin_outputs_in_struct()
{
	auto &execution = get_entry_point();

	bool legacy = hlsl_options.shader_model <= 30;
	active_output_builtins.for_each_bit([&](uint32_t i) {
		const char *type = nullptr;
		const char *semantic = nullptr;
		auto builtin = static_cast<BuiltIn>(i);
		switch (builtin)
		{
		case BuiltInPosition:
			type = is_position_invariant() && backend.support_precise_qualifier ? "precise float4" : "float4";
			semantic = legacy ? "POSITION" : "SV_Position";
			break;

		case BuiltInSampleMask:
			if (hlsl_options.shader_model < 41 || execution.model != ExecutionModelFragment)
				SPIRV_CROSS_THROW("Sample Mask output is only supported in PS 4.1 or higher.");
			type = "uint";
			semantic = "SV_Coverage";
			break;

		case BuiltInFragDepth:
			type = "float";
			if (legacy)
			{
				semantic = "DEPTH";
			}
			else
			{
				if (hlsl_options.shader_model >= 50 && execution.flags.get(ExecutionModeDepthGreater))
					semantic = "SV_DepthGreaterEqual";
				else if (hlsl_options.shader_model >= 50 && execution.flags.get(ExecutionModeDepthLess))
					semantic = "SV_DepthLessEqual";
				else
					semantic = "SV_Depth";
			}
			break;

		case BuiltInClipDistance:
		{
			static const char *types[] = { "float", "float2", "float3", "float4" };

			// HLSL is a bit weird here, use SV_ClipDistance0, SV_ClipDistance1 and so on with vectors.
			if (execution.model == ExecutionModelMeshEXT)
			{
				if (clip_distance_count > 4)
					SPIRV_CROSS_THROW("Clip distance count > 4 not supported for mesh shaders.");

				if (clip_distance_count == 1)
				{
					// Avoids having to hack up access_chain code. Makes it trivially indexable.
					statement("float gl_ClipDistance[1] : SV_ClipDistance;");
				}
				else
				{
					// Replace array with vector directly, avoids any weird fixup path.
					statement(types[clip_distance_count - 1], " gl_ClipDistance : SV_ClipDistance;");
				}
			}
			else
			{
				for (uint32_t clip = 0; clip < clip_distance_count; clip += 4)
				{
					uint32_t to_declare = clip_distance_count - clip;
					if (to_declare > 4)
						to_declare = 4;

					uint32_t semantic_index = clip / 4;

					statement(types[to_declare - 1], " ", builtin_to_glsl(builtin, StorageClassOutput), semantic_index,
					          " : SV_ClipDistance", semantic_index, ";");
				}
			}
			break;
		}

		case BuiltInCullDistance:
		{
			static const char *types[] = { "float", "float2", "float3", "float4" };

			// HLSL is a bit weird here, use SV_CullDistance0, SV_CullDistance1 and so on with vectors.
			if (execution.model == ExecutionModelMeshEXT)
			{
				if (cull_distance_count > 4)
					SPIRV_CROSS_THROW("Cull distance count > 4 not supported for mesh shaders.");

				if (cull_distance_count == 1)
				{
					// Avoids having to hack up access_chain code. Makes it trivially indexable.
					statement("float gl_CullDistance[1] : SV_CullDistance;");
				}
				else
				{
					// Replace array with vector directly, avoids any weird fixup path.
					statement(types[cull_distance_count - 1], " gl_CullDistance : SV_CullDistance;");
				}
			}
			else
			{
				for (uint32_t cull = 0; cull < cull_distance_count; cull += 4)
				{
					uint32_t to_declare = cull_distance_count - cull;
					if (to_declare > 4)
						to_declare = 4;

					uint32_t semantic_index = cull / 4;

					statement(types[to_declare - 1], " ", builtin_to_glsl(builtin, StorageClassOutput), semantic_index,
					          " : SV_CullDistance", semantic_index, ";");
				}
			}
			break;
		}

		case BuiltInPointSize:
			// If point_size_compat is enabled, just ignore PointSize.
			// PointSize does not exist in HLSL, but some code bases might want to be able to use these shaders,
			// even if it means working around the missing feature.
			if (legacy)
			{
				type = "float";
				semantic = "PSIZE";
			}
			else if (!hlsl_options.point_size_compat)
				SPIRV_CROSS_THROW("Unsupported builtin in HLSL.");
			break;

		case BuiltInLayer:
		case BuiltInPrimitiveId:
		case BuiltInViewportIndex:
		case BuiltInPrimitiveShadingRateKHR:
		case BuiltInCullPrimitiveEXT:
			// per-primitive attributes handled separatly
			break;

		case BuiltInPrimitivePointIndicesEXT:
		case BuiltInPrimitiveLineIndicesEXT:
		case BuiltInPrimitiveTriangleIndicesEXT:
			// meshlet local-index buffer handled separatly
			break;

		default:
			SPIRV_CROSS_THROW("Unsupported builtin in HLSL.");
		}

		if (type && semantic)
			statement(type, " ", builtin_to_glsl(builtin, StorageClassOutput), " : ", semantic, ";");
	    });
}